

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_decl_gccattribute(CPState *cp,CPDecl *decl)

{
  uint uVar1;
  int iVar2;
  CPState *in_RSI;
  long in_RDI;
  CTSize vsize;
  GCstr *attrstr;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  CPDeclIdx in_stack_ffffffffffffffe0;
  CTSize in_stack_ffffffffffffffe4;
  CPDecl *decl_00;
  
  cp_next((CPState *)0x1696e8);
  cp_check((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffdc);
  cp_check((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffdc);
  do {
    if (*(int *)(in_RDI + 4) == 0x29) break;
    if (*(int *)(in_RDI + 4) == 0x100) {
      decl_00 = *(CPDecl **)(in_RDI + 0x10);
      cp_next((CPState *)0x16973f);
      in_stack_ffffffffffffffe0 = decl_00->specpos;
      if (in_stack_ffffffffffffffe0 == 0xe6a57578) {
LAB_001697e5:
        in_stack_ffffffffffffffe4 =
             cp_decl_sizeattr((CPState *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
        if (in_stack_ffffffffffffffe4 != 0) {
          uVar1 = 0x1f;
          if (in_stack_ffffffffffffffe4 != 0) {
            for (; in_stack_ffffffffffffffe4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
            }
          }
          *(uint *)((long)&(in_RSI->sb).buf + 4) =
               *(uint *)((long)&(in_RSI->sb).buf + 4) & 0xffffff0f | (uVar1 & 0xf) << 4;
        }
      }
      else if (in_stack_ffffffffffffffe0 == 0xe7471a47) {
LAB_001697b3:
        cp_decl_align((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (CPDecl *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      }
      else {
        if (in_stack_ffffffffffffffe0 != 0x1af1262a) {
          if (in_stack_ffffffffffffffe0 == 0x1c311a30) goto LAB_001697b3;
          if ((in_stack_ffffffffffffffe0 == 0x1d3d8c5d) || (in_stack_ffffffffffffffe0 == 0x3f4777d9)
             ) {
            cp_decl_mode(in_RSI,decl_00);
            goto LAB_001698a8;
          }
          if (in_stack_ffffffffffffffe0 != 0x5b224448) {
            if (in_stack_ffffffffffffffe0 != 0x75ce2002) goto LAB_00169843;
            goto LAB_001697e5;
          }
        }
        *(uint *)((long)&(in_RSI->sb).buf + 4) = *(uint *)((long)&(in_RSI->sb).buf + 4) | 2;
      }
    }
    else {
      if (*(int *)(in_RDI + 4) < 0x10d) break;
      cp_next((CPState *)0x169843);
LAB_00169843:
      iVar2 = cp_opt((CPState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
      if (iVar2 != 0) {
        while( true ) {
          uVar1 = in_stack_ffffffffffffffdc & 0xffffff;
          if (*(int *)(in_RDI + 4) != 0x29) {
            uVar1 = CONCAT13(*(int *)(in_RDI + 4) != 0x103,(int3)in_stack_ffffffffffffffdc);
          }
          in_stack_ffffffffffffffdc = uVar1;
          if ((char)(in_stack_ffffffffffffffdc >> 0x18) == '\0') break;
          cp_next((CPState *)0x169891);
        }
        cp_check((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
      }
    }
LAB_001698a8:
    iVar2 = cp_opt((CPState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
  } while (iVar2 != 0);
  cp_check((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffdc);
  cp_check((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffdc);
  return;
}

Assistant:

static void cp_decl_gccattribute(CPState *cp, CPDecl *decl)
{
  cp_next(cp);
  cp_check(cp, '(');
  cp_check(cp, '(');
  while (cp->tok != ')') {
    if (cp->tok == CTOK_IDENT) {
      GCstr *attrstr = cp->str;
      cp_next(cp);
      switch (attrstr->hash) {
      case H_(e7471a47,4d0a050c): case H_(1c311a30,407787d5):  /* aligned */
	cp_decl_align(cp, decl);
	break;
      case H_(5b224448,e7fa3369): case H_(1af1262a,6fe1f4a9):  /* packed */
	decl->attr |= CTFP_PACKED;
	break;
      case H_(3f4777d9,ab58d362): case H_(1d3d8c5d,a4ccaedf):  /* mode */
	cp_decl_mode(cp, decl);
	break;
      case H_(e6a57578,a46255fb): case H_(75ce2002,cffcd6f9):  /* vector_size */
	{
	  CTSize vsize = cp_decl_sizeattr(cp);
	  if (vsize) CTF_INSERT(decl->attr, VSIZEP, lj_fls(vsize));
	}
	break;
#if LJ_TARGET_X86
      case H_(80199aeb,b13dfdf7): case H_(bf8a4622,fcdf05d8):  /* regparm */
	CTF_INSERT(decl->fattr, REGPARM, cp_decl_sizeattr(cp));
	decl->fattr |= CTFP_CCONV;
	break;
      case H_(a8174bd6,2f052a31): case H_(b41f25a7,561af38e):  /* cdecl */
	CTF_INSERT(decl->fattr, CCONV, CTCC_CDECL);
	decl->fattr |= CTFP_CCONV;
	break;
      case H_(813acdf4,2f4dc8da): case H_(407d56cf,30df0843):  /* thiscall */
	CTF_INSERT(decl->fattr, CCONV, CTCC_THISCALL);
	decl->fattr |= CTFP_CCONV;
	break;
      case H_(c93885bc,ac2a6b49): case H_(17092923,17979644):  /* fastcall */
	CTF_INSERT(decl->fattr, CCONV, CTCC_FASTCALL);
	decl->fattr |= CTFP_CCONV;
	break;
      case H_(27bff963,43de753b): case H_(8014db5c,728f7bd2):  /* stdcall */
	CTF_INSERT(decl->fattr, CCONV, CTCC_STDCALL);
	decl->fattr |= CTFP_CCONV;
	break;
      case H_(f35337b4,ca968d6c): case H_(b2ade19f,1467c44f):  /* sseregparm */
	decl->fattr |= CTF_SSEREGPARM;
	decl->fattr |= CTFP_CCONV;
	break;
#endif
      default:  /* Skip all other attributes. */
	goto skip_attr;
      }
    } else if (cp->tok >= CTOK_FIRSTDECL) {  /* For __attribute((const)) etc. */
      cp_next(cp);
    skip_attr:
      if (cp_opt(cp, '(')) {
	while (cp->tok != ')' && cp->tok != CTOK_EOF) cp_next(cp);
	cp_check(cp, ')');
      }
    } else {
      break;
    }
    if (!cp_opt(cp, ',')) break;
  }
  cp_check(cp, ')');
  cp_check(cp, ')');
}